

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFAnnotationObjectHelper::getAppearanceStream
          (QPDFAnnotationObjectHelper *this,string *which,string *state)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle ap_sub;
  QPDFObjectHandle ap;
  string desired_state;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  string local_40;
  
  getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_50);
  if (*(long *)((string *)CONCAT71(in_register_00000009,in_CL) + 8) == 0) {
    getAppearanceState_abi_cxx11_((string *)(local_50 + 0x10),(QPDFAnnotationObjectHelper *)which);
  }
  else {
    std::__cxx11::string::string
              ((string *)(local_50 + 0x10),(string *)CONCAT71(in_register_00000009,in_CL));
  }
  bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_50);
  if (bVar2) {
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)local_50);
    bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_68);
    uVar1 = local_68._8_8_;
    if (bVar2) {
      local_68._8_8_ = (element_type *)0x0;
      (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)local_68._0_8_;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar1;
      local_68._0_8_ = (element_type *)0x0;
LAB_0014d5aa:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      goto LAB_0014d604;
    }
    bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_68);
    if (bVar2 && (element_type *)local_40._M_string_length != (element_type *)0x0) {
      QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_68);
      bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)this);
      if (bVar2) goto LAB_0014d5aa;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_QPDFObjectHelper).super_BaseHandle);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  }
  QPDFObjectHandle::newNull();
LAB_0014d604:
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFAnnotationObjectHelper::getAppearanceStream(std::string const& which, std::string const& state)
{
    QPDFObjectHandle ap = getAppearanceDictionary();
    std::string desired_state = state.empty() ? getAppearanceState() : state;
    if (ap.isDictionary()) {
        QPDFObjectHandle ap_sub = ap.getKey(which);
        if (ap_sub.isStream()) {
            // According to the spec, Appearance State is supposed to refer to a subkey of the
            // appearance stream when /AP is a dictionary, but files have been seen in the wild
            // where Appearance State is `/N` and `/AP` is a stream. Therefore, if `which` points to
            // a stream, disregard state and just use the stream. See qpdf issue #949 for details.
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP stream");
            return ap_sub;
        }
        if (ap_sub.isDictionary() && (!desired_state.empty())) {
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP dictionary");
            QPDFObjectHandle ap_sub_val = ap_sub.getKey(desired_state);
            if (ap_sub_val.isStream()) {
                QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP sub stream");
                return ap_sub_val;
            }
        }
    }
    QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP null");
    return QPDFObjectHandle::newNull();
}